

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O1

int LoadEXRWithLayer(float **out_rgba,int *width,int *height,char *filename,char *layername,
                    char **err)

{
  pointer pcVar1;
  size_t sVar2;
  uchar **ppuVar3;
  bool bVar4;
  pointer pLVar5;
  pointer pLVar6;
  int iVar7;
  int iVar8;
  ostream *poVar9;
  char *pcVar10;
  long lVar11;
  size_t sVar12;
  long lVar13;
  ulong uVar14;
  float *pfVar15;
  ulong uVar16;
  int iVar17;
  int unaff_EBP;
  int iVar18;
  int iVar19;
  pointer pLVar20;
  int *piVar21;
  float fVar22;
  EXRImage exr_image;
  vector<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_> channels;
  string ch_name;
  EXRVersion exr_version;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  layer_names;
  stringstream ss;
  EXRHeader exr_header;
  long local_440;
  int local_434;
  int local_430;
  int local_42c;
  EXRImage local_428;
  vector<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_> local_3f8;
  int *local_3e0;
  char *local_3d8;
  ulong local_3d0;
  char local_3c8 [16];
  undefined1 *local_3b8;
  long local_3b0;
  undefined1 local_3a8 [16];
  undefined1 *local_398;
  long local_390;
  undefined1 local_388 [16];
  int *local_378;
  EXRVersion local_36c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_358;
  undefined1 local_340 [8];
  _Alloc_hider local_338;
  ostream local_330 [8];
  char local_328 [104];
  ios_base local_2c0 [264];
  int *local_1b8 [2];
  int local_1a8 [10];
  int local_180;
  int local_17c;
  int local_178;
  EXRChannelInfo *local_150;
  int *local_148;
  int local_140;
  int *local_138;
  
  if (out_rgba == (float **)0x0) {
    piVar21 = (int *)((long)&((EXRHeader *)local_1b8)->data_window + 8);
    local_1b8[0] = piVar21;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1b8,"Invalid argument for LoadEXR()","");
    if (err != (char **)0x0) {
      pcVar10 = strdup((char *)local_1b8[0]);
      *err = pcVar10;
    }
    if (local_1b8[0] != piVar21) {
      operator_delete(local_1b8[0]);
    }
    return -3;
  }
  local_378 = width;
  memset((EXRHeader *)local_1b8,0,0x188);
  local_428.tiles = (EXRTile *)0x0;
  local_428.next_level = (TEXRImage *)0x0;
  local_428.level_x = 0;
  local_428.level_y = 0;
  local_428.images = (uchar **)0x0;
  local_428.width = 0;
  local_428.height = 0;
  local_428.num_channels = 0;
  local_428.num_tiles = 0;
  iVar7 = ParseEXRVersionFromFile(&local_36c,filename);
  if (iVar7 == 0) {
    if (local_36c.non_image != 0 || local_36c.multipart != 0) {
      local_340 = (undefined1  [8])local_330;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_340,
                 "Loading multipart or DeepImage is not supported  in LoadEXR() API","");
      if (err != (char **)0x0) {
        pcVar10 = strdup((char *)local_340);
        *err = pcVar10;
      }
      if (local_340 != (undefined1  [8])local_330) {
        operator_delete((void *)local_340);
      }
      iVar7 = -4;
      goto LAB_001c68ae;
    }
    bVar4 = true;
  }
  else {
    std::__cxx11::stringstream::stringstream((stringstream *)local_340);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_330,"Failed to open EXR file or read version info from EXR file. code(",0x41);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)local_330,iVar7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,")",1);
    std::__cxx11::stringbuf::str();
    if (err != (char **)0x0) {
      pcVar10 = strdup(local_3d8);
      *err = pcVar10;
    }
    if (local_3d8 != local_3c8) {
      operator_delete(local_3d8);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_340);
    std::ios_base::~ios_base(local_2c0);
LAB_001c68ae:
    bVar4 = false;
    unaff_EBP = iVar7;
  }
  if (!bVar4) {
    return unaff_EBP;
  }
  iVar7 = ParseEXRHeaderFromFile((EXRHeader *)local_1b8,&local_36c,filename,err);
  if (iVar7 != 0) {
    FreeEXRHeader((EXRHeader *)local_1b8);
    return iVar7;
  }
  if (0 < local_140) {
    lVar11 = 0;
    do {
      if (local_148[lVar11] == 1) {
        local_138[lVar11] = 2;
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < local_140);
  }
  iVar7 = LoadEXRImageFromFile(&local_428,(EXRHeader *)local_1b8,filename,err);
  if (iVar7 != 0) {
    FreeEXRHeader((EXRHeader *)local_1b8);
    return iVar7;
  }
  local_358.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_358.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_358.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tinyexr::GetLayers((EXRHeader *)local_1b8,&local_358);
  local_3f8.super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3f8.super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3f8.super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3b8 = local_3a8;
  local_3e0 = height;
  if (layername == (char *)0x0) {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b8,"");
  }
  else {
    sVar12 = strlen(layername);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_3b8,layername,layername + sVar12);
  }
  pLVar6 = local_3f8.
           super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>._M_impl
           .super__Vector_impl_data._M_finish;
  pLVar5 = local_3f8.
           super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>._M_impl
           .super__Vector_impl_data._M_start;
  pLVar20 = local_3f8.
            super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (local_3f8.super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      local_3f8.super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    do {
      pcVar1 = (pLVar20->name)._M_dataplus._M_p;
      if (&(pLVar20->name).field_2 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar1) {
        operator_delete(pcVar1);
      }
      pLVar20 = pLVar20 + 1;
    } while (pLVar20 != pLVar6);
    local_3f8.super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>.
    _M_impl.super__Vector_impl_data._M_finish = pLVar5;
  }
  if (0 < local_140) {
    lVar11 = 0;
    poVar9 = (ostream *)0x0;
    do {
      std::__cxx11::string::string
                ((string *)&local_3d8,local_150->name + lVar11,(allocator *)local_340);
      if (local_3b0 == 0) {
        uVar14 = std::__cxx11::string::rfind((char)(string *)&local_3d8,0x2e);
        if ((uVar14 != 0xffffffffffffffff) && (uVar14 < local_3d0)) {
          std::__cxx11::string::substr((ulong)local_340,(ulong)&local_3d8);
LAB_001c6b45:
          std::__cxx11::string::operator=((string *)&local_3d8,(string *)local_340);
          if (local_340 != (undefined1  [8])local_330) {
            operator_delete((void *)local_340);
          }
        }
LAB_001c6b6a:
        local_398 = local_388;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_398,local_3d8,local_3d8 + local_3d0);
        local_338._M_p = local_328;
        local_340 = (undefined1  [8])poVar9;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_338,local_398,local_398 + local_390);
        if (local_398 != local_388) {
          operator_delete(local_398);
        }
        std::vector<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>::push_back
                  (&local_3f8,(value_type *)local_340);
        if (local_338._M_p != local_328) {
          operator_delete(local_338._M_p);
        }
      }
      else {
        local_340 = (undefined1  [8])local_330;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_340,local_3b8,local_3b8 + local_3b0);
        std::__cxx11::string::_M_replace_aux((ulong)local_340,(ulong)local_338._M_p,0,'\x01');
        lVar13 = std::__cxx11::string::find((char *)&local_3d8,(ulong)local_340,0);
        if (local_340 != (undefined1  [8])local_330) {
          operator_delete((void *)local_340);
        }
        if (lVar13 != -1) {
          if (lVar13 == 0) {
            std::__cxx11::string::substr((ulong)local_340,(ulong)&local_3d8);
            goto LAB_001c6b45;
          }
          goto LAB_001c6b6a;
        }
      }
      if (local_3d8 != local_3c8) {
        operator_delete(local_3d8);
      }
      poVar9 = poVar9 + 1;
      lVar11 = lVar11 + 0x110;
    } while ((long)poVar9 < (long)local_140);
  }
  if (local_3b8 != local_3a8) {
    operator_delete(local_3b8);
  }
  if ((long)local_3f8.
            super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)local_3f8.
            super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>.
            _M_impl.super__Vector_impl_data._M_start == 0) {
    local_340 = (undefined1  [8])local_330;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_340,"Layer Not Found","");
    if (err != (char **)0x0) {
      pcVar10 = strdup((char *)local_340);
      *err = pcVar10;
    }
    if (local_340 != (undefined1  [8])local_330) {
      operator_delete((void *)local_340);
    }
    iVar7 = -0xd;
    goto LAB_001c71fe;
  }
  uVar16 = ((long)local_3f8.
                  super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)local_3f8.
                  super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
  uVar14 = 4;
  if (uVar16 < 4) {
    uVar14 = uVar16;
  }
  local_42c = -1;
  lVar11 = 0;
  local_430 = -1;
  local_434 = -1;
  iVar7 = -1;
  do {
    pcVar10 = (char *)((long)&((local_3f8.
                                super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>
                                ._M_impl.super__Vector_impl_data._M_start)->name)._M_dataplus._M_p +
                      lVar11);
    piVar21 = (int *)((long)&(local_3f8.
                              super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>
                              ._M_impl.super__Vector_impl_data._M_start)->index + lVar11);
    iVar8 = std::__cxx11::string::compare(pcVar10);
    if (iVar8 == 0) {
      local_42c = *piVar21;
    }
    else {
      iVar8 = std::__cxx11::string::compare(pcVar10);
      if (iVar8 == 0) {
        local_430 = *piVar21;
      }
      else {
        iVar8 = std::__cxx11::string::compare(pcVar10);
        if (iVar8 == 0) {
          local_434 = *piVar21;
        }
        else {
          iVar8 = std::__cxx11::string::compare(pcVar10);
          if (iVar8 == 0) {
            iVar7 = *piVar21;
          }
        }
      }
    }
    piVar21 = local_3e0;
    lVar11 = lVar11 + 0x28;
  } while ((uVar14 + (uVar14 == 0)) * 0x28 != lVar11);
  if ((long)local_3f8.
            super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)local_3f8.
            super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>.
            _M_impl.super__Vector_impl_data._M_start == 0x28) {
    sVar2 = (local_3f8.
             super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>.
             _M_impl.super__Vector_impl_data._M_start)->index;
    pfVar15 = (float *)malloc((long)local_428.height * (long)local_428.width * 0x10);
    *out_rgba = pfVar15;
    iVar7 = (int)sVar2;
    piVar21 = local_3e0;
    if (local_180 == 0) {
      if (0 < local_428.height * local_428.width) {
        lVar11 = 0;
        lVar13 = 0;
        do {
          fVar22 = *(float *)(local_428.images[iVar7] + lVar11);
          (*out_rgba)[lVar11] = fVar22;
          (*out_rgba)[lVar11 + 1] = fVar22;
          (*out_rgba)[lVar11 + 2] = fVar22;
          (*out_rgba)[lVar11 + 3] = fVar22;
          lVar13 = lVar13 + 1;
          lVar11 = lVar11 + 4;
        } while (lVar13 < (long)local_428.height * (long)local_428.width);
      }
    }
    else if (0 < local_428.num_tiles) {
      lVar11 = 0;
      do {
        if (0 < local_178) {
          iVar8 = 0;
          do {
            if (0 < local_17c) {
              iVar18 = 0;
              do {
                iVar19 = local_428.tiles[lVar11].offset_x * local_17c + iVar18;
                if ((iVar19 < local_428.width) &&
                   (iVar17 = local_178 * local_428.tiles[lVar11].offset_y + iVar8,
                   iVar17 < local_428.height)) {
                  iVar19 = iVar19 + local_428.width * iVar17;
                  ppuVar3 = local_428.tiles[lVar11].images;
                  lVar13 = (long)(local_17c * iVar8 + iVar18);
                  (*out_rgba)[iVar19 * 4] = *(float *)(ppuVar3[iVar7] + lVar13 * 4);
                  (*out_rgba)[iVar19 * 4 + 1] = *(float *)(ppuVar3[iVar7] + lVar13 * 4);
                  (*out_rgba)[iVar19 * 4 + 2] = *(float *)(ppuVar3[iVar7] + lVar13 * 4);
                  (*out_rgba)[iVar19 * 4 + 3] = *(float *)(ppuVar3[iVar7] + lVar13 * 4);
                }
                iVar18 = iVar18 + 1;
              } while (iVar18 < local_17c);
            }
            iVar8 = iVar8 + 1;
          } while (iVar8 < local_178);
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 < local_428.num_tiles);
    }
LAB_001c7138:
    *local_378 = local_428.width;
    *piVar21 = local_428.height;
    iVar7 = 0;
  }
  else {
    if (local_42c == -1) {
      local_340 = (undefined1  [8])local_330;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_340,"R channel not found","");
    }
    else if (local_430 == -1) {
      local_340 = (undefined1  [8])local_330;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_340,"G channel not found","");
    }
    else {
      if (local_434 != -1) {
        pfVar15 = (float *)malloc((long)local_428.height * (long)local_428.width * 0x10);
        *out_rgba = pfVar15;
        if (local_180 == 0) {
          if (0 < local_428.height * local_428.width) {
            lVar11 = 0;
            lVar13 = 0;
            do {
              (*out_rgba)[lVar11] = *(float *)(local_428.images[local_42c] + lVar11);
              (*out_rgba)[lVar11 + 1] = *(float *)(local_428.images[local_430] + lVar11);
              (*out_rgba)[lVar11 + 2] = *(float *)(local_428.images[local_434] + lVar11);
              fVar22 = 1.0;
              if (iVar7 != -1) {
                fVar22 = *(float *)(local_428.images[iVar7] + lVar11);
              }
              (*out_rgba)[lVar11 + 3] = fVar22;
              lVar13 = lVar13 + 1;
              lVar11 = lVar11 + 4;
            } while (lVar13 < (long)local_428.height * (long)local_428.width);
          }
        }
        else if (0 < local_428.num_tiles) {
          local_440 = 0;
          do {
            if (0 < local_178) {
              iVar8 = 0;
              do {
                if (0 < local_17c) {
                  iVar18 = 0;
                  do {
                    iVar19 = local_428.tiles[local_440].offset_x * local_17c + iVar18;
                    if ((iVar19 < local_428.width) &&
                       (iVar17 = local_178 * local_428.tiles[local_440].offset_y + iVar8,
                       iVar17 < local_428.height)) {
                      iVar19 = iVar19 + local_428.width * iVar17;
                      ppuVar3 = local_428.tiles[local_440].images;
                      lVar11 = (long)(local_17c * iVar8 + iVar18);
                      (*out_rgba)[iVar19 * 4] = *(float *)(ppuVar3[local_42c] + lVar11 * 4);
                      (*out_rgba)[iVar19 * 4 + 1] = *(float *)(ppuVar3[local_430] + lVar11 * 4);
                      (*out_rgba)[iVar19 * 4 + 2] = *(float *)(ppuVar3[local_434] + lVar11 * 4);
                      fVar22 = 1.0;
                      if (iVar7 != -1) {
                        fVar22 = *(float *)(ppuVar3[iVar7] + lVar11 * 4);
                      }
                      (*out_rgba)[(int)(iVar19 * 4 | 3)] = fVar22;
                    }
                    iVar18 = iVar18 + 1;
                  } while (iVar18 < local_17c);
                }
                iVar8 = iVar8 + 1;
              } while (iVar8 < local_178);
            }
            local_440 = local_440 + 1;
            piVar21 = local_3e0;
          } while (local_440 < local_428.num_tiles);
        }
        goto LAB_001c7138;
      }
      local_340 = (undefined1  [8])local_330;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_340,"B channel not found","");
    }
    if (err != (char **)0x0) {
      pcVar10 = strdup((char *)local_340);
      *err = pcVar10;
    }
    if (local_340 != (undefined1  [8])local_330) {
      operator_delete((void *)local_340);
    }
    iVar7 = -4;
  }
LAB_001c71fe:
  FreeEXRHeader((EXRHeader *)local_1b8);
  FreeEXRImage(&local_428);
  std::vector<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>::~vector(&local_3f8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_358);
  return iVar7;
}

Assistant:

int LoadEXRWithLayer(float **out_rgba, int *width, int *height,
                     const char *filename, const char *layername,
                     const char **err) {
  if (out_rgba == NULL) {
    tinyexr::SetErrorMessage("Invalid argument for LoadEXR()", err);
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

  EXRVersion exr_version;
  EXRImage exr_image;
  EXRHeader exr_header;
  InitEXRHeader(&exr_header);
  InitEXRImage(&exr_image);

  {
    int ret = ParseEXRVersionFromFile(&exr_version, filename);
    if (ret != TINYEXR_SUCCESS) {
      std::stringstream ss;
      ss << "Failed to open EXR file or read version info from EXR file. code("
         << ret << ")";
      tinyexr::SetErrorMessage(ss.str(), err);
      return ret;
    }

    if (exr_version.multipart || exr_version.non_image) {
      tinyexr::SetErrorMessage(
          "Loading multipart or DeepImage is not supported  in LoadEXR() API",
          err);
      return TINYEXR_ERROR_INVALID_DATA;  // @fixme.
    }
  }

  {
    int ret = ParseEXRHeaderFromFile(&exr_header, &exr_version, filename, err);
    if (ret != TINYEXR_SUCCESS) {
      FreeEXRHeader(&exr_header);
      return ret;
    }
  }

  // Read HALF channel as FLOAT.
  for (int i = 0; i < exr_header.num_channels; i++) {
    if (exr_header.pixel_types[i] == TINYEXR_PIXELTYPE_HALF) {
      exr_header.requested_pixel_types[i] = TINYEXR_PIXELTYPE_FLOAT;
    }
  }

  // TODO: Probably limit loading to layers (channels) selected by layer index
  {
    int ret = LoadEXRImageFromFile(&exr_image, &exr_header, filename, err);
    if (ret != TINYEXR_SUCCESS) {
      FreeEXRHeader(&exr_header);
      return ret;
    }
  }

  // RGBA
  int idxR = -1;
  int idxG = -1;
  int idxB = -1;
  int idxA = -1;

  std::vector<std::string> layer_names;
  tinyexr::GetLayers(exr_header, layer_names);

  std::vector<tinyexr::LayerChannel> channels;
  tinyexr::ChannelsInLayer(
      exr_header, layername == NULL ? "" : std::string(layername), channels);

  if (channels.size() < 1) {
    tinyexr::SetErrorMessage("Layer Not Found", err);
    FreeEXRHeader(&exr_header);
    FreeEXRImage(&exr_image);
    return TINYEXR_ERROR_LAYER_NOT_FOUND;
  }

  size_t ch_count = channels.size() < 4 ? channels.size() : 4;
  for (size_t c = 0; c < ch_count; c++) {
    const tinyexr::LayerChannel &ch = channels[c];

    if (ch.name == "R") {
      idxR = int(ch.index);
    } else if (ch.name == "G") {
      idxG = int(ch.index);
    } else if (ch.name == "B") {
      idxB = int(ch.index);
    } else if (ch.name == "A") {
      idxA = int(ch.index);
    }
  }

  if (channels.size() == 1) {
    int chIdx = int(channels.front().index);
    // Grayscale channel only.

    (*out_rgba) = reinterpret_cast<float *>(
        malloc(4 * sizeof(float) * static_cast<size_t>(exr_image.width) *
               static_cast<size_t>(exr_image.height)));

    if (exr_header.tiled) {
      for (int it = 0; it < exr_image.num_tiles; it++) {
        for (int j = 0; j < exr_header.tile_size_y; j++) {
          for (int i = 0; i < exr_header.tile_size_x; i++) {
            const int ii = exr_image.tiles[it].offset_x *
                               static_cast<int>(exr_header.tile_size_x) +
                           i;
            const int jj = exr_image.tiles[it].offset_y *
                               static_cast<int>(exr_header.tile_size_y) +
                           j;
            const int idx = ii + jj * static_cast<int>(exr_image.width);

            // out of region check.
            if (ii >= exr_image.width) {
              continue;
            }
            if (jj >= exr_image.height) {
              continue;
            }
            const int srcIdx = i + j * exr_header.tile_size_x;
            unsigned char **src = exr_image.tiles[it].images;
            (*out_rgba)[4 * idx + 0] =
                reinterpret_cast<float **>(src)[chIdx][srcIdx];
            (*out_rgba)[4 * idx + 1] =
                reinterpret_cast<float **>(src)[chIdx][srcIdx];
            (*out_rgba)[4 * idx + 2] =
                reinterpret_cast<float **>(src)[chIdx][srcIdx];
            (*out_rgba)[4 * idx + 3] =
                reinterpret_cast<float **>(src)[chIdx][srcIdx];
          }
        }
      }
    } else {
      for (int i = 0; i < exr_image.width * exr_image.height; i++) {
        const float val =
            reinterpret_cast<float **>(exr_image.images)[chIdx][i];
        (*out_rgba)[4 * i + 0] = val;
        (*out_rgba)[4 * i + 1] = val;
        (*out_rgba)[4 * i + 2] = val;
        (*out_rgba)[4 * i + 3] = val;
      }
    }
  } else {
    // Assume RGB(A)

    if (idxR == -1) {
      tinyexr::SetErrorMessage("R channel not found", err);

      FreeEXRHeader(&exr_header);
      FreeEXRImage(&exr_image);
      return TINYEXR_ERROR_INVALID_DATA;
    }

    if (idxG == -1) {
      tinyexr::SetErrorMessage("G channel not found", err);
      FreeEXRHeader(&exr_header);
      FreeEXRImage(&exr_image);
      return TINYEXR_ERROR_INVALID_DATA;
    }

    if (idxB == -1) {
      tinyexr::SetErrorMessage("B channel not found", err);
      FreeEXRHeader(&exr_header);
      FreeEXRImage(&exr_image);
      return TINYEXR_ERROR_INVALID_DATA;
    }

    (*out_rgba) = reinterpret_cast<float *>(
        malloc(4 * sizeof(float) * static_cast<size_t>(exr_image.width) *
               static_cast<size_t>(exr_image.height)));
    if (exr_header.tiled) {
      for (int it = 0; it < exr_image.num_tiles; it++) {
        for (int j = 0; j < exr_header.tile_size_y; j++) {
          for (int i = 0; i < exr_header.tile_size_x; i++) {
            const int ii =
                exr_image.tiles[it].offset_x * exr_header.tile_size_x + i;
            const int jj =
                exr_image.tiles[it].offset_y * exr_header.tile_size_y + j;
            const int idx = ii + jj * exr_image.width;

            // out of region check.
            if (ii >= exr_image.width) {
              continue;
            }
            if (jj >= exr_image.height) {
              continue;
            }
            const int srcIdx = i + j * exr_header.tile_size_x;
            unsigned char **src = exr_image.tiles[it].images;
            (*out_rgba)[4 * idx + 0] =
                reinterpret_cast<float **>(src)[idxR][srcIdx];
            (*out_rgba)[4 * idx + 1] =
                reinterpret_cast<float **>(src)[idxG][srcIdx];
            (*out_rgba)[4 * idx + 2] =
                reinterpret_cast<float **>(src)[idxB][srcIdx];
            if (idxA != -1) {
              (*out_rgba)[4 * idx + 3] =
                  reinterpret_cast<float **>(src)[idxA][srcIdx];
            } else {
              (*out_rgba)[4 * idx + 3] = 1.0;
            }
          }
        }
      }
    } else {
      for (int i = 0; i < exr_image.width * exr_image.height; i++) {
        (*out_rgba)[4 * i + 0] =
            reinterpret_cast<float **>(exr_image.images)[idxR][i];
        (*out_rgba)[4 * i + 1] =
            reinterpret_cast<float **>(exr_image.images)[idxG][i];
        (*out_rgba)[4 * i + 2] =
            reinterpret_cast<float **>(exr_image.images)[idxB][i];
        if (idxA != -1) {
          (*out_rgba)[4 * i + 3] =
              reinterpret_cast<float **>(exr_image.images)[idxA][i];
        } else {
          (*out_rgba)[4 * i + 3] = 1.0;
        }
      }
    }
  }

  (*width) = exr_image.width;
  (*height) = exr_image.height;

  FreeEXRHeader(&exr_header);
  FreeEXRImage(&exr_image);

  return TINYEXR_SUCCESS;
}